

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

bool dgrminer::is_pattern_edge_smaller_than
               (array<int,_10UL> *pattern_edge1,array<int,_10UL> *pattern_edge2,bool ignore_edge_id)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  
  iVar3 = pattern_edge1->_M_elems[0];
  iVar4 = pattern_edge1->_M_elems[1];
  iVar5 = pattern_edge2->_M_elems[0];
  iVar6 = pattern_edge2->_M_elems[1];
  if (iVar3 < iVar4) {
    if (iVar5 < iVar6) {
      bVar7 = iVar4 == iVar6 && iVar5 < iVar3 || iVar4 < iVar6;
    }
    else {
      bVar7 = iVar4 <= iVar5;
    }
  }
  else if (iVar5 < iVar6) {
    bVar7 = iVar3 < iVar6;
  }
  else {
    bVar7 = iVar4 < iVar6 && iVar3 == iVar5 || iVar3 < iVar5;
  }
  if (((iVar4 == iVar6 && iVar3 == iVar5) & ~bVar7) == 1) {
    lVar8 = 2;
    do {
      if (10 - (ulong)ignore_edge_id == lVar8) {
        return bVar7;
      }
      piVar1 = pattern_edge1->_M_elems + lVar8;
      piVar2 = pattern_edge2->_M_elems + lVar8;
      if (*piVar1 < *piVar2) {
        return true;
      }
      lVar8 = lVar8 + 1;
    } while (*piVar1 <= *piVar2);
  }
  return bVar7;
}

Assistant:

bool
    is_pattern_edge_smaller_than(const std::array<int, 10> &pattern_edge1, const std::array<int, 10> &pattern_edge2,
                                 bool ignore_edge_id)
    {
        int max_index = (ignore_edge_id) ? 9 : 10;
        bool result = false;
        int i1 = pattern_edge1[0];
        int j1 = pattern_edge1[1];
        int i2 = pattern_edge2[0];
        int j2 = pattern_edge2[1];
        if (i1 < j1) // edge1 is forward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = (j1 < j2) || (i1 > i2 && j1 == j2);
            }
            else // edge2 is backward
            {

                result = j1 <= i2;
            }
        }
        else // edge1 is backward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = i1 < j2;
            }
            else // edge2 is backward
            {
                result = (i1 < i2) || (i1 == i2 && j1 < j2);
            }
        }
        if (!result && i1 == i2 && j1 == j2)
        {
            // check also edge ID (the 10th element)
            for (int k = 2; k < max_index; k++)
            {
                if (pattern_edge1[k] < pattern_edge2[k])
                {
                    result = true;
                    break;
                }
                else if (pattern_edge1[k] > pattern_edge2[k])
                {
                    break;
                }
            }
        }
        return result;
    }